

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  ulong uVar1;
  pointer pcVar2;
  impl_string_type *piVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  error_category *peVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  path *ppVar9;
  path *extraout_RAX;
  _Alloc_hider nhl;
  error_code *peVar10;
  format fVar11;
  time_t *lwt;
  bool bVar12;
  path target;
  path work;
  path pe;
  file_status sls;
  file_status fs;
  iterator __begin3;
  iterator __end3;
  path local_1b8;
  error_code *local_198;
  uint local_18c;
  path *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  error_category *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  path local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  error_category *local_138;
  path local_130;
  long *local_110;
  long local_108;
  long local_100 [2];
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  long local_d0 [2];
  iterator local_c0;
  iterator local_78;
  
  if ((p->_path)._M_string_length == 0) {
    peVar7 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar7;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_198 = ec;
  sVar6 = path::root_name_length(p);
  peVar10 = local_198;
  uVar1 = (p->_path)._M_string_length;
  if ((sVar6 < uVar1) && ((p->_path)._M_dataplus._M_p[sVar6] == '/')) {
    local_160._path._M_dataplus._M_p = (pointer)&local_160._path.field_2;
    pcVar2 = (p->_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_160,pcVar2,pcVar2 + uVar1);
    peVar10 = local_198;
  }
  else {
    absolute(&local_160,p,local_198);
  }
  local_1b8._path._M_dataplus._M_p = (pointer)((long)&local_1b8 + 0x10);
  local_1b8._path._M_string_length = 0;
  local_1b8._path.field_2._M_local_buf[0] = '\0';
  nhl._M_p = (pointer)0x0;
  lwt = (time_t *)0x0;
  detail::status_ex((path *)(local_f0 + 8),(error_code *)&local_160,(file_status *)peVar10,
                    (uintmax_t *)0x0,(uintmax_t *)0x0,(time_t *)0x0,0);
  local_188 = __return_storage_ptr__;
  if (peVar10->_M_value == none) {
    if (local_f0._8_4_ != 1) {
      local_140 = &(__return_storage_ptr__->_path).field_2;
      do {
        sVar6 = path::root_name_length(&local_160);
        peVar7 = (error_category *)path::root_name_length(&local_160);
        if (peVar7 < local_160._path._M_string_length) {
          local_138 = (error_category *)
                      (ulong)(local_160._path._M_dataplus._M_p[(long)peVar7] == '/');
          nhl._M_p = local_160._path._M_dataplus._M_p;
        }
        else {
          local_138 = (error_category *)0x0;
        }
        local_1b8._path._M_string_length = 0;
        *local_1b8._path._M_dataplus._M_p = '\0';
        local_78._first._M_current = local_160._path._M_dataplus._M_p;
        path::iterator::iterator(&local_c0,&local_160,&local_78._first);
        local_110 = (long *)(local_160._path._M_dataplus._M_p + local_160._path._M_string_length);
        path::iterator::iterator(&local_78,&local_160,(const_iterator *)&local_110);
        local_138 = (error_category *)((long)local_138 + sVar6);
        local_18c = 0;
        while (local_c0._iter._M_current != local_78._iter._M_current) {
          local_110 = local_100;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_c0._current._path._M_dataplus._M_p,
                     local_c0._current._path._M_dataplus._M_p +
                     local_c0._current._path._M_string_length);
          if (local_108 == 0) {
            bVar12 = true;
          }
          else {
            local_e0._M_allocated_capacity = (size_type)local_d0;
            fVar11 = 0x1aafc8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,".","");
            path::postprocess_path_with_format((path *)&local_e0,fVar11);
            iVar4 = path::compare((path *)&local_110,(path *)&local_e0);
            bVar12 = iVar4 == 0;
            if ((long *)local_e0._M_allocated_capacity != local_d0) {
              operator_delete((void *)local_e0._M_allocated_capacity,local_d0[0] + 1);
            }
          }
          iVar4 = 5;
          if (!bVar12) {
            fVar11 = 0x1a89f7;
            local_180 = &local_170;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"..","");
            path::postprocess_path_with_format((path *)&local_180,fVar11);
            iVar5 = path::compare((path *)&local_110,(path *)&local_180);
            if (local_180 != &local_170) {
              operator_delete(local_180,local_170._M_allocated_capacity + 1);
            }
            if (iVar5 == 0) {
              path::parent_path((path *)&local_180,&local_1b8);
              std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_180);
              if (local_180 != &local_170) {
                operator_delete(local_180,local_170._M_allocated_capacity + 1);
              }
            }
            else {
              operator/(&local_130,&local_1b8,(path *)&local_110);
              local_180 = &local_170;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_180,local_130._path._M_dataplus._M_p,
                         local_130._path._M_dataplus._M_p + local_130._path._M_string_length);
              peVar7 = local_178;
              if (local_180 != &local_170) {
                operator_delete(local_180,local_170._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._path._M_dataplus._M_p != &local_130._path.field_2) {
                operator_delete(local_130._path._M_dataplus._M_p,
                                local_130._path.field_2._M_allocated_capacity + 1);
              }
              if (local_138 < peVar7) {
                operator/((path *)&local_180,&local_1b8,(path *)&local_110);
                peVar10 = local_198;
                detail::symlink_status_ex
                          ((path *)local_f0,(error_code *)&local_180,(uintmax_t *)local_198,
                           (uintmax_t *)nhl._M_p,lwt);
                if (local_180 != &local_170) {
                  operator_delete(local_180,local_170._M_allocated_capacity + 1);
                }
                if (peVar10->_M_value == 0) {
                  if (local_f0._0_4_ == 4) {
                    operator/(&local_130,&local_1b8,(path *)&local_110);
                    read_symlink((path *)&local_180,&local_130,peVar10);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_130._path._M_dataplus._M_p != &local_130._path.field_2) {
                      operator_delete(local_130._path._M_dataplus._M_p,
                                      local_130._path.field_2._M_allocated_capacity + 1);
                    }
                    if (peVar10->_M_value == 0) {
                      peVar7 = (error_category *)path::root_name_length((path *)&local_180);
                      if ((peVar7 < local_178) &&
                         (nhl._M_p = (pointer)local_180,
                         local_180->_M_local_buf[(long)peVar7] == '/')) {
                        iVar4 = 5;
                        ppVar9 = (path *)std::__cxx11::string::_M_assign((string *)&local_1b8);
                      }
                      else {
                        iVar4 = 5;
                        ppVar9 = path::operator/=(&local_1b8,(path *)&local_180);
                      }
                    }
                    else {
                      (local_188->_path)._M_dataplus._M_p = (pointer)local_140;
                      (local_188->_path)._M_string_length = 0;
                      (local_188->_path).field_2._M_local_buf[0] = '\0';
                      iVar4 = 1;
                      ppVar9 = local_188;
                      nhl._M_p = (pointer)local_140;
                    }
                    if (local_180 != &local_170) {
                      operator_delete(local_180,local_170._M_allocated_capacity + 1);
                      ppVar9 = extraout_RAX;
                    }
                    local_18c = (uint)CONCAT71((int7)((ulong)ppVar9 >> 8),1);
                  }
                  else {
                    iVar4 = 0;
                    path::operator/=(&local_1b8,(path *)&local_110);
                  }
                }
                else {
                  (local_188->_path)._M_dataplus._M_p = (pointer)local_140;
                  (local_188->_path)._M_string_length = 0;
                  (local_188->_path).field_2._M_local_buf[0] = '\0';
                  iVar4 = 1;
                  nhl._M_p = (pointer)local_140;
                }
              }
              else {
                path::operator/=(&local_1b8,(path *)&local_110);
              }
            }
          }
          if (local_110 != local_100) {
            operator_delete(local_110,local_100[0] + 1);
          }
          if ((iVar4 != 5) && (iVar4 != 0)) goto LAB_0019c8d0;
          path::iterator::operator++(&local_c0);
        }
        iVar4 = 4;
LAB_0019c8d0:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._current._path._M_dataplus._M_p != &local_78._current._path.field_2) {
          operator_delete(local_78._current._path._M_dataplus._M_p,
                          local_78._current._path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._current._path._M_dataplus._M_p != &local_c0._current._path.field_2) {
          operator_delete(local_c0._current._path._M_dataplus._M_p,
                          local_c0._current._path.field_2._M_allocated_capacity + 1);
        }
        if (iVar4 == 4) {
          iVar4 = 0;
          std::__cxx11::string::_M_assign((string *)&local_160);
        }
        if (iVar4 != 0) goto LAB_0019c3ee;
      } while ((local_18c & 1) != 0);
      peVar7 = (error_category *)std::_V2::system_category();
      local_198->_M_value = none;
      local_198->_M_cat = peVar7;
      (local_188->_path)._M_dataplus._M_p = (pointer)local_140;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&local_1b8 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._path._M_dataplus._M_p == paVar8) {
        local_140->_M_allocated_capacity =
             CONCAT71(local_1b8._path.field_2._M_allocated_capacity._1_7_,
                      local_1b8._path.field_2._M_local_buf[0]);
        *(undefined8 *)((long)local_140 + 8) = local_1b8._path.field_2._8_8_;
      }
      else {
        (local_188->_path)._M_dataplus._M_p = local_1b8._path._M_dataplus._M_p;
        (local_188->_path).field_2._M_allocated_capacity =
             CONCAT71(local_1b8._path.field_2._M_allocated_capacity._1_7_,
                      local_1b8._path.field_2._M_local_buf[0]);
      }
      (local_188->_path)._M_string_length = local_1b8._path._M_string_length;
      piVar3 = &local_1b8._path;
      local_1b8._path._M_dataplus._M_p = (pointer)paVar8;
      goto LAB_0019c3e4;
    }
    peVar7 = (error_category *)std::_V2::system_category();
    local_198->_M_value = regular;
    local_198->_M_cat = peVar7;
  }
  paVar8 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar8;
  piVar3 = &__return_storage_ptr__->_path;
LAB_0019c3e4:
  piVar3->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
LAB_0019c3ee:
  if (local_1b8._path._M_dataplus._M_p != (pointer)((long)&local_1b8 + 0x10)) {
    operator_delete(local_1b8._path._M_dataplus._M_p,
                    CONCAT71(local_1b8._path.field_2._M_allocated_capacity._1_7_,
                             local_1b8._path.field_2._M_local_buf[0]) + 1);
  }
  ppVar9 = local_188;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._path._M_dataplus._M_p != &local_160._path.field_2) {
    operator_delete(local_160._path._M_dataplus._M_p,
                    local_160._path.field_2._M_allocated_capacity + 1);
  }
  return ppVar9;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        auto rootPathLen = work._prefixLength + work.root_name_length() + (work.has_root_directory() ? 1 : 0);
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= rootPathLen) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}